

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::session_impl::session_impl
          (session_impl *this,io_context *ioc,
          vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> *pack,
          disk_io_constructor_type *disk_io_constructor,session_flags_t flags)

{
  session_settings *this_00;
  vector<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>_>_>
  *pvVar1;
  counters *this_01;
  mutex *pmVar2;
  atomic_count *paVar3;
  _Rb_tree_header *p_Var4;
  int queue_limit;
  alert_category_t alert_mask;
  io_context *piVar5;
  torrent_array *ptVar6;
  vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_> *pvVar7;
  node_ids_t *pnVar8;
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  *pvVar9;
  _Deque_base<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
  *p_Var10;
  _Deque_base<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
  *p_Var11;
  undefined8 *puVar12;
  long lVar13;
  pointer *__ptr_1;
  pointer *__ptr;
  undefined1 local_1b0 [16];
  _Manager_type local_1a0;
  _Invoker_type local_198;
  unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>
  *local_190;
  resolver *local_188;
  context *local_180;
  _Any_data local_178;
  undefined1 local_168 [16];
  _Any_data local_158;
  undefined1 local_148 [24];
  deque<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
  *local_130;
  deadline_timer *local_128;
  utp_socket_manager *local_120;
  utp_socket_manager *local_118;
  deadline_timer *local_110;
  i2p_connection *local_108;
  port_filter *local_100;
  ip_filter *local_f8;
  tracker_manager *local_f0;
  bandwidth_manager *local_e8;
  bandwidth_manager *local_e0;
  alert_manager *local_d8;
  context *local_d0;
  peer_class_pool *local_c8;
  condition_variable *local_c0;
  _Any_data local_b8;
  undefined1 local_a8 [16];
  _Any_data local_98;
  undefined1 local_88 [16];
  _Any_data local_78;
  undefined1 local_68 [24];
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  (this->super_enable_shared_from_this<libtorrent::aux::session_impl>)._M_weak_this.
  super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> =
       (__weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (this->super_session_interface).super_session_logger._vptr_session_logger =
       (_func_int **)&PTR_should_log_004e3118;
  (this->super_dht_observer).super_dht_logger._vptr_dht_logger =
       (_func_int **)&PTR_should_log_004e3430;
  (this->super_portmap_callback)._vptr_portmap_callback =
       (_func_int **)&PTR_on_port_mapping_004e3488;
  (this->super_lsd_callback)._vptr_lsd_callback = (_func_int **)&PTR_on_lsd_peer_004e34b0;
  (this->super_error_handler_interface)._vptr_error_handler_interface =
       (_func_int **)&PTR_on_exception_004e34d8;
  *(undefined1 (*) [16])&(this->mut).super___mutex_base._M_mutex = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->mut).super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  (this->mut).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  ::std::condition_variable::condition_variable(&this->cond);
  this_00 = &this->m_settings;
  local_c0 = &this->cond;
  session_settings::session_settings(this_00,(settings_pack *)pack);
  memset(&this->m_torrent_lists,0,0x110);
  local_c8 = &this->m_classes;
  ::std::_Deque_base<libtorrent::peer_class,_std::allocator<libtorrent::peer_class>_>::
  _M_initialize_map((_Deque_base<libtorrent::peer_class,_std::allocator<libtorrent::peer_class>_> *)
                    &this->m_classes,0);
  pvVar1 = &(this->m_classes).m_free_list;
  (pvVar1->
  super__Vector_base<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->
  super__Vector_base<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_classes).m_free_list.
  super__Vector_base<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01 = &this->m_stats_counters;
  counters::counters(this_01);
  (this->m_peer_allocator).super_torrent_peer_allocator_interface.
  _vptr_torrent_peer_allocator_interface = (_func_int **)&PTR_allocate_peer_entry_004e7ad8;
  (this->m_peer_allocator).m_ipv4_peer_pool.super_simple_segregated_storage<unsigned_long> =
       (void *)0x0;
  (this->m_peer_allocator).m_ipv4_peer_pool.list.ptr = (char *)0x0;
  (this->m_peer_allocator).m_ipv4_peer_pool.list.sz = 0;
  (this->m_peer_allocator).m_ipv4_peer_pool.requested_size = 0x28;
  (this->m_peer_allocator).m_ipv4_peer_pool.next_size = 500;
  (this->m_peer_allocator).m_ipv4_peer_pool.start_size = 500;
  *(undefined1 (*) [16])&(this->m_peer_allocator).m_ipv4_peer_pool.max_size = (undefined1  [16])0x0;
  (this->m_peer_allocator).m_ipv6_peer_pool.list.ptr = (char *)0x0;
  (this->m_peer_allocator).m_ipv6_peer_pool.list.sz = 0;
  (this->m_peer_allocator).m_ipv6_peer_pool.requested_size = 0x30;
  (this->m_peer_allocator).m_ipv6_peer_pool.next_size = 500;
  (this->m_peer_allocator).m_ipv6_peer_pool.start_size = 500;
  *(undefined1 (*) [16])&(this->m_peer_allocator).m_ipv6_peer_pool.max_size = (undefined1  [16])0x0;
  (this->m_peer_allocator).m_i2p_peer_pool.list.ptr = (char *)0x0;
  (this->m_peer_allocator).m_i2p_peer_pool.list.sz = 0;
  (this->m_peer_allocator).m_i2p_peer_pool.requested_size = 0x28;
  (this->m_peer_allocator).m_i2p_peer_pool.next_size = 500;
  (this->m_peer_allocator).m_i2p_peer_pool.start_size = 500;
  *(undefined1 (*) [16])&(this->m_peer_allocator).m_i2p_peer_pool.max_size = (undefined1  [16])0x0;
  (this->m_peer_allocator).m_total_allocations = 0;
  (this->m_peer_allocator).m_live_bytes = 0;
  (this->m_peer_allocator).m_live_allocations = 0;
  (this->m_block_info_storage).
  super__Vector_base<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_block_info_storage).
  super__Vector_base<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_block_info_storage).
  super__Vector_base<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_io_context = ioc;
  boost::asio::ssl::context::context(&this->m_ssl_ctx,tls_client);
  local_180 = &this->m_peer_ssl_ctx;
  local_d0 = &this->m_ssl_ctx;
  boost::asio::ssl::context::context(local_180,tls);
  pmVar2 = &(this->m_settings).m_mutex;
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
  local_1b0._0_8_ = pmVar2;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_1b0);
  local_1b0[8] = true;
  queue_limit = (this->m_settings).m_store.m_ints._M_elems[99];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_1b0);
  local_1b0[8] = false;
  local_1b0._0_8_ = pmVar2;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_1b0);
  local_1b0[8] = true;
  alert_mask.m_val = (this->m_settings).m_store.m_ints._M_elems[0x75];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_1b0);
  local_d8 = &this->m_alerts;
  alert_manager::alert_manager(&this->m_alerts,queue_limit,alert_mask);
  if ((disk_io_constructor->super__Function_base)._M_manager == (_Manager_type)0x0) {
    local_1b0._8_8_ = 0;
    local_1b0._0_8_ = default_disk_io_constructor;
    local_198 = ::std::
                _Function_handler<std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&),_std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(*)(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&)>
                ::_M_invoke;
    local_1a0 = ::std::
                _Function_handler<std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&),_std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(*)(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&)>
                ::_M_manager;
  }
  else {
    ::std::
    function<std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&)>
    ::function((function<std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&)>
                *)local_1b0,disk_io_constructor);
    if (local_1a0 == (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
  }
  local_190 = &this->m_disk_thread;
  (*local_198)((_Any_data *)local_190,(io_context *)local_1b0,
               (settings_interface *)this->m_io_context,(counters *)this_00);
  if (local_1a0 != (_Manager_type)0x0) {
    (*local_1a0)((_Any_data *)local_1b0,(_Any_data *)local_1b0,__destroy_functor);
  }
  bandwidth_manager::bandwidth_manager(&this->m_download_rate,1);
  local_e0 = &this->m_download_rate;
  bandwidth_manager::bandwidth_manager(&this->m_upload_rate,0);
  this->m_global_class = 0;
  this->m_tcp_peer_class = 0;
  (this->m_local_peer_class).m_val = 0;
  local_188 = &this->m_host_resolver;
  local_e8 = &this->m_upload_rate;
  resolver::resolver(local_188,this->m_io_context);
  local_148._0_16_ = (undefined1  [16])0x0;
  local_158 = (_Any_data)0x0;
  puVar12 = (undefined8 *)operator_new(0x18);
  *puVar12 = send_udp_packet_listen;
  puVar12[1] = 0;
  puVar12[2] = this;
  local_158._M_unused._M_object = puVar12;
  local_148._8_8_ =
       ::std::
       _Function_handler<void_(const_libtorrent::aux::listen_socket_handle_&,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>))(const_libtorrent::aux::listen_socket_handle_&,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>_>
       ::_M_invoke;
  local_148._0_8_ =
       ::std::
       _Function_handler<void_(const_libtorrent::aux::listen_socket_handle_&,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>))(const_libtorrent::aux::listen_socket_handle_&,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>_>
       ::_M_manager;
  local_78 = (_Any_data)0x0;
  local_68._0_16_ = (undefined1  [16])0x0;
  puVar12 = (undefined8 *)operator_new(0x18);
  *puVar12 = send_udp_packet_hostname_listen;
  puVar12[1] = 0;
  puVar12[2] = this;
  local_78._M_unused._M_object = puVar12;
  local_68._8_8_ =
       ::std::
       _Function_handler<void_(const_libtorrent::aux::listen_socket_handle_&,_const_char_*,_int,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>,_std::_Placeholder<6>))(const_libtorrent::aux::listen_socket_handle_&,_const_char_*,_int,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>_>
       ::_M_invoke;
  local_68._0_8_ =
       ::std::
       _Function_handler<void_(const_libtorrent::aux::listen_socket_handle_&,_const_char_*,_int,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>,_std::_Placeholder<6>))(const_libtorrent::aux::listen_socket_handle_&,_const_char_*,_int,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>_>
       ::_M_manager;
  tracker_manager::tracker_manager
            (&this->m_tracker_manager,(send_fun_t *)&local_158,(send_fun_hostname_t *)&local_78,
             this_01,&local_188->super_resolver_interface,this_00,(session_logger *)this);
  if ((code *)local_68._0_8_ != (code *)0x0) {
    (*(code *)local_68._0_8_)(&local_78,&local_78,__destroy_functor);
  }
  if ((code *)local_148._0_8_ != (code *)0x0) {
    (*(code *)local_148._0_8_)(&local_158,&local_158,__destroy_functor);
  }
  ptVar6 = &(this->m_torrents).m_array;
  (ptVar6->
  super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (ptVar6->
  super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_torrents).m_array.
  super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_torrents).m_index._M_h._M_buckets = &(this->m_torrents).m_index._M_h._M_single_bucket;
  (this->m_torrents).m_index._M_h._M_bucket_count = 1;
  (this->m_torrents).m_index._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->m_torrents).m_index._M_h._M_element_count = 0;
  (this->m_torrents).m_index._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->m_torrents).m_index._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (this->m_torrents).m_obfuscated_index._M_h._M_buckets =
       &(this->m_torrents).m_obfuscated_index._M_h._M_single_bucket;
  (this->m_torrents).m_obfuscated_index._M_h._M_bucket_count = 1;
  (this->m_torrents).m_obfuscated_index._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->m_torrents).m_obfuscated_index._M_h._M_element_count = 0;
  (this->m_torrents).m_obfuscated_index._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->m_torrents).m_obfuscated_index._M_h._M_rehash_policy._M_next_resize
       = (undefined1  [16])0x0;
  pvVar7 = &(this->m_download_queue).
            super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>;
  (pvVar7->
  super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar7->
  super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_download_queue).
    super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>.
    super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->m_undead_peers).
  super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_undead_peers).
  super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piVar5 = this->m_io_context;
  (this->m_work).executor_.io_context_ = piVar5;
  (this->m_work).executor_.bits_ = 0;
  (this->m_work).owns_ = true;
  LOCK();
  paVar3 = &piVar5->impl_->outstanding_work_;
  (paVar3->super___atomic_base<long>)._M_i = (paVar3->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  p_Var4 = &(this->m_connections)._M_t._M_impl.super__Rb_tree_header;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var4 = &(this->m_incoming_sockets)._M_t._M_impl.super__Rb_tree_header;
  (this->m_incoming_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_incoming_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->m_incoming_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var4->_M_header;
  (this->m_incoming_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var4->_M_header;
  (this->m_incoming_sockets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8 = &this->m_peer_class_filter;
  local_f0 = &this->m_tracker_manager;
  ip_filter::ip_filter(local_f8);
  (this->m_peer_class_type_filter).m_peer_class_type_mask._M_elems[0] = 0xffffffff;
  (this->m_peer_class_type_filter).m_peer_class_type_mask._M_elems[1] = 0xffffffff;
  (this->m_peer_class_type_filter).m_peer_class_type_mask._M_elems[2] = 0xffffffff;
  (this->m_peer_class_type_filter).m_peer_class_type_mask._M_elems[3] = 0xffffffff;
  (this->m_peer_class_type_filter).m_peer_class_type_mask._M_elems[4] = 0xffffffff;
  (this->m_peer_class_type_filter).m_peer_class_type_mask._M_elems[5] = 0xffffffff;
  local_100 = &this->m_port_filter;
  (this->m_peer_class_type_filter).m_peer_class_type._M_elems[0] = 0;
  (this->m_peer_class_type_filter).m_peer_class_type._M_elems[1] = 0;
  (this->m_peer_class_type_filter).m_peer_class_type._M_elems[2] = 0;
  (this->m_peer_class_type_filter).m_peer_class_type._M_elems[3] = 0;
  *(undefined1 (*) [16])((this->m_peer_class_type_filter).m_peer_class_type._M_elems + 4) =
       (undefined1  [16])0x0;
  (this->m_ip_filter).super___shared_ptr<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  port_filter::port_filter(local_100);
  local_108 = &this->m_i2p_conn;
  (this->m_listen_sockets).
  super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_listen_sockets).
  super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_outgoing_interfaces).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->m_outgoing_interfaces).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_outgoing_interfaces).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_listen_interfaces).
  super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_listen_interfaces).
  super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_ip_notifier =
       (__uniq_ptr_data<libtorrent::aux::ip_change_notifier,_std::default_delete<libtorrent::aux::ip_change_notifier>,_true,_true>
        )0x0;
  (this->m_listen_interfaces).
  super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this->m_listen_socket_version = 0;
  i2p_connection::i2p_connection(local_108,this->m_io_context);
  (this->m_i2p_listen_socket).
  super__Optional_base<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>,_true,_false,_false>
  .
  super__Optional_payload_base<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>_>
  ._M_engaged = false;
  this->m_interface_index = '\0';
  pnVar8 = &(this->m_dht_state).nids;
  (pnVar8->
  super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pnVar8->
  super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_dht_state).nids.
    super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  pvVar9 = &(this->m_dht_state).nodes;
  (pvVar9->
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar9->
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar9 = &(this->m_dht_state).nodes6;
  (pvVar9->
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar9->
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_dht_state).nodes6.
    super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  this->m_optimistic_unchoke_time_scaler = 0;
  this->m_disconnect_time_scaler = 0x5a;
  this->m_auto_scrape_time_scaler = 0xb4;
  *(undefined1 (*) [16])&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL> =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x10 =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x20 =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x30 =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x40 =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x50 =
       (undefined1  [16])0x0;
  lVar13 = ::std::chrono::_V2::system_clock::now();
  (this->m_created).__d.__r = lVar13;
  (this->m_last_tick).__d.__r = lVar13;
  (this->m_last_second_tick).__d.__r = lVar13 + -900000000;
  (this->m_last_choke).__d.__r = lVar13;
  (this->m_last_auto_manage).__d.__r = lVar13;
  this->m_next_port = 0;
  *(undefined8 *)((long)&(this->m_dht_storage_constructor).super__Function_base._M_functor + 8) = 0;
  this->m_dht_storage =
       (__uniq_ptr_data<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>,_true,_true>
        )0x0;
  (this->m_dht).super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_dht).super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(code **)&(this->m_dht_storage_constructor).super__Function_base._M_functor =
       libtorrent::dht::dht_default_storage_constructor;
  (this->m_dht_storage_constructor)._M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>_(const_libtorrent::settings_interface_&),_std::unique_ptr<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>_(*)(const_libtorrent::settings_interface_&)>
       ::_M_invoke;
  (this->m_dht_storage_constructor).super__Function_base._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>_(const_libtorrent::settings_interface_&),_std::unique_ptr<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>_(*)(const_libtorrent::settings_interface_&)>
       ::_M_manager;
  (this->m_dht_router_nodes).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dht_router_nodes).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_dht_router_nodes).
    super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->m_dht_nodes).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_dht_nodes).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>
            (&(this->m_dht_announce_timer).impl_,this->m_io_context,(type *)0x0);
  this->m_dht_interval_update_torrents = 0;
  this->m_outstanding_router_lookups = 0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (_Any_data)0x0;
  local_110 = &this->m_dht_announce_timer;
  puVar12 = (undefined8 *)operator_new(0x18);
  local_118 = &this->m_utp_socket_manager;
  *puVar12 = send_udp_packet;
  puVar12[1] = 0;
  puVar12[2] = this;
  local_98._M_unused._M_object = puVar12;
  local_88._8_8_ =
       ::std::
       _Function_handler<void_(std::weak_ptr<libtorrent::aux::utp_socket_interface>,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>))(std::weak_ptr<libtorrent::aux::utp_socket_interface>,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>_>
       ::_M_invoke;
  local_88._0_8_ =
       ::std::
       _Function_handler<void_(std::weak_ptr<libtorrent::aux::utp_socket_interface>,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>))(std::weak_ptr<libtorrent::aux::utp_socket_interface>,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>_>
       ::_M_manager;
  local_50._8_8_ = 0;
  local_38 = ::std::_Function_handler<$55b7542e$>::_M_invoke;
  local_40 = ::std::_Function_handler<$55b7542e$>::_M_manager;
  local_50._M_unused._M_object = this;
  aux::utp_socket_manager::utp_socket_manager
            (local_118,(send_fun_t *)&local_98,(incoming_utp_callback_t *)&local_50,
             this->m_io_context,this_00,this_01,(void *)0x0);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if ((code *)local_88._0_8_ != (code *)0x0) {
    (*(code *)local_88._0_8_)(&local_98,&local_98,__destroy_functor);
  }
  local_168 = (undefined1  [16])0x0;
  local_178 = (_Any_data)0x0;
  puVar12 = (undefined8 *)operator_new(0x18);
  *puVar12 = send_udp_packet;
  puVar12[1] = 0;
  puVar12[2] = this;
  local_178._M_unused._M_object = puVar12;
  local_168._8_8_ =
       ::std::
       _Function_handler<void_(std::weak_ptr<libtorrent::aux::utp_socket_interface>,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>))(std::weak_ptr<libtorrent::aux::utp_socket_interface>,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>_>
       ::_M_invoke;
  local_168._0_8_ =
       ::std::
       _Function_handler<void_(std::weak_ptr<libtorrent::aux::utp_socket_interface>,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>))(std::weak_ptr<libtorrent::aux::utp_socket_interface>,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>_>
       ::_M_manager;
  local_b8 = (_Any_data)0x0;
  local_a8 = (undefined1  [16])0x0;
  puVar12 = (undefined8 *)operator_new(0x18);
  *puVar12 = on_incoming_utp_ssl;
  puVar12[1] = 0;
  puVar12[2] = this;
  local_b8._M_unused._M_object = puVar12;
  local_a8._8_8_ = ::std::_Function_handler<$1a29d5db$>::_M_invoke;
  local_a8._0_8_ = ::std::_Function_handler<$1a29d5db$>::_M_manager;
  aux::utp_socket_manager::utp_socket_manager
            (&this->m_ssl_utp_socket_manager,(send_fun_t *)&local_178,
             (incoming_utp_callback_t *)&local_b8,this->m_io_context,this_00,this_01,local_180);
  if ((code *)local_a8._0_8_ != (code *)0x0) {
    (*(code *)local_a8._0_8_)(&local_b8,&local_b8,__destroy_functor);
  }
  if ((code *)local_168._0_8_ != (code *)0x0) {
    (*(code *)local_168._0_8_)(&local_178,&local_178,__destroy_functor);
  }
  this->m_boost_connections = 0;
  local_120 = &this->m_ssl_utp_socket_manager;
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>(&(this->m_timer).impl_,this->m_io_context,(type *)0x0);
  p_Var10 = &(this->m_dht_torrents).
             super__Deque_base<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
  ;
  (p_Var10->_M_impl).super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (p_Var10->_M_impl).super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  p_Var10 = &(this->m_dht_torrents).
             super__Deque_base<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
  ;
  (p_Var10->_M_impl).super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (p_Var10->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  p_Var10 = &(this->m_dht_torrents).
             super__Deque_base<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
  ;
  (p_Var10->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (p_Var10->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  p_Var10 = &(this->m_dht_torrents).
             super__Deque_base<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
  ;
  (p_Var10->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (p_Var10->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_dht_torrents).
  super__Deque_base<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_dht_torrents).
  super__Deque_base<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_128 = &this->m_timer;
  ::std::
  _Deque_base<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
  ::_M_initialize_map(&(this->m_dht_torrents).
                       super__Deque_base<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
                      ,0);
  p_Var11 = &(this->m_prio_torrents).
             super__Deque_base<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
  ;
  (p_Var11->_M_impl).super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (p_Var11->_M_impl).super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  p_Var11 = &(this->m_prio_torrents).
             super__Deque_base<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
  ;
  (p_Var11->_M_impl).super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (p_Var11->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  p_Var11 = &(this->m_prio_torrents).
             super__Deque_base<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
  ;
  (p_Var11->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (p_Var11->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  p_Var11 = &(this->m_prio_torrents).
             super__Deque_base<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
  ;
  (p_Var11->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (p_Var11->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_prio_torrents).
  super__Deque_base<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_prio_torrents).
  super__Deque_base<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_130 = &this->m_dht_torrents;
  ::std::
  _Deque_base<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
  ::_M_initialize_map(&(this->m_prio_torrents).
                       super__Deque_base<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
                      ,0);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>
            (&(this->m_lsd_announce_timer).impl_,this->m_io_context,(type *)0x0);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>
            (&(this->m_close_file_timer).impl_,this->m_io_context,(type *)0x0);
  memset(&this->m_next_downloading_connect_torrent,0,0x8c);
  this->m_paused = (bool)(flags.m_val >> 2 & 1);
  this->m_posted_stats_header = false;
  validate_settings(this);
  return;
}

Assistant:

session_impl::session_impl(io_context& ioc, settings_pack const& pack
		, disk_io_constructor_type disk_io_constructor
		, session_flags_t const flags)
		: m_settings(pack)
		, m_io_context(ioc)
#if TORRENT_USE_SSL
		, m_ssl_ctx(ssl::context::tls_client)
#ifdef TORRENT_SSL_PEERS
		, m_peer_ssl_ctx(ssl::context::tls)
#endif
#endif // TORRENT_USE_SSL
		, m_alerts(m_settings.get_int(settings_pack::alert_queue_size)
			, alert_category_t{static_cast<unsigned int>(m_settings.get_int(settings_pack::alert_mask))})
		, m_disk_thread((disk_io_constructor ? disk_io_constructor : default_disk_io_constructor)
			(m_io_context, m_settings, m_stats_counters))
		, m_download_rate(peer_connection::download_channel)
		, m_upload_rate(peer_connection::upload_channel)
		, m_host_resolver(m_io_context)
		, m_tracker_manager(
			std::bind(&session_impl::send_udp_packet_listen, this, _1, _2, _3, _4, _5)
			, std::bind(&session_impl::send_udp_packet_hostname_listen, this, _1, _2, _3, _4, _5, _6)
			, m_stats_counters
			, m_host_resolver
			, m_settings
#if !defined TORRENT_DISABLE_LOGGING || TORRENT_USE_ASSERTS
			, *this
#endif
			)
		, m_work(make_work_guard(m_io_context))
#if TORRENT_USE_I2P
		, m_i2p_conn(m_io_context)
#endif
		, m_created(clock_type::now())
		, m_last_tick(m_created)
		, m_last_second_tick(m_created - milliseconds(900))
		, m_last_choke(m_created)
		, m_last_auto_manage(m_created)
#ifndef TORRENT_DISABLE_DHT
		, m_dht_announce_timer(m_io_context)
#endif
		, m_utp_socket_manager(
			std::bind(&session_impl::send_udp_packet, this, _1, _2, _3, _4, _5)
			, [this](socket_type s) { this->incoming_connection(std::move(s)); }
			, m_io_context
			, m_settings, m_stats_counters, nullptr)
#ifdef TORRENT_SSL_PEERS
		, m_ssl_utp_socket_manager(
			std::bind(&session_impl::send_udp_packet, this, _1, _2, _3, _4, _5)
			, std::bind(&session_impl::on_incoming_utp_ssl, this, _1)
			, m_io_context
			, m_settings, m_stats_counters
			, &m_peer_ssl_ctx)
#endif
		, m_timer(m_io_context)
		, m_lsd_announce_timer(m_io_context)
		, m_close_file_timer(m_io_context)
		, m_paused(flags & session::paused)
	{
#if !defined TORRENT_DISABLE_LOGGING || TORRENT_USE_ASSERTS
		validate_settings();
#endif
	}